

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

int ws_get_send_text(void *arg,void *buf,size_t *szp,nni_type t)

{
  byte bVar1;
  int iVar2;
  _Bool b;
  nni_ws *ws;
  nni_type t_local;
  size_t *szp_local;
  void *buf_local;
  void *arg_local;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x60));
  bVar1 = *(byte *)((long)arg + 0x57);
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
  iVar2 = nni_copyout_bool((_Bool)(bVar1 & 1),buf,szp,t);
  return iVar2;
}

Assistant:

static int
ws_get_send_text(void *arg, void *buf, size_t *szp, nni_type t)
{
	nni_ws *ws = arg;
	bool    b;
	nni_mtx_lock(&ws->mtx);
	b = ws->send_text;
	nni_mtx_unlock(&ws->mtx);

	return (nni_copyout_bool(b, buf, szp, t));
}